

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O0

bool jessilib::equalsi<char,char>
               (basic_string_view<char,_std::char_traits<char>_> lhs,
               basic_string_view<char,_std::char_traits<char>_> rhs)

{
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  decode_result dVar4;
  decode_result dVar5;
  bool local_7a;
  byte local_79;
  decode_result rhs_front;
  decode_result lhs_front;
  basic_string_view<char,_std::char_traits<char>_> rhs_local;
  basic_string_view<char,_std::char_traits<char>_> lhs_local;
  
  rhs_local._M_len = (size_t)rhs._M_str;
  lhs_front.units = rhs._M_len;
  rhs_local._M_str = (char *)lhs._M_len;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&lhs_front.units);
  if (sVar2 == sVar3) {
    while( true ) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str);
      local_79 = 0;
      if (!bVar1) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&lhs_front.units);
        local_79 = bVar1 ^ 0xff;
      }
      if ((local_79 & 1) == 0) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str);
        local_7a = false;
        if (bVar1) {
          local_7a = std::basic_string_view<char,_std::char_traits<char>_>::empty
                               ((basic_string_view<char,_std::char_traits<char>_> *)&lhs_front.units
                               );
        }
        return local_7a;
      }
      in_string_00._M_str = lhs._M_str;
      in_string_00._M_len = (size_t)rhs_local._M_str;
      dVar4 = decode_codepoint<char>(in_string_00);
      lhs_front._0_8_ = dVar4.units;
      in_string._M_str = (char *)rhs_local._M_len;
      in_string._M_len = lhs_front.units;
      dVar5 = decode_codepoint<char>(in_string);
      if ((lhs_front._0_8_ == 0) || (dVar5.units == 0)) {
        return false;
      }
      bVar1 = equalsi(dVar4.codepoint,dVar5.codepoint);
      if (!bVar1) break;
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str,
                 lhs_front._0_8_);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&lhs_front.units,dVar5.units);
    }
  }
  return false;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}